

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_entry_list_t.c
# Opt level: O2

MMDB_entry_data_list_s * test_array_value(MMDB_entry_data_list_s *entry_data_list)

{
  MMDB_entry_data_list_s *pMVar1;
  
  pMVar1 = entry_data_list->next;
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                ,9,(pMVar1->entry_data).type,"==",0xb,"\'array\' key\'s value is an array",0);
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                ,0xd,(pMVar1->entry_data).data_size,"==",3,"\'array\' key\'s value has 3 elements",0
               );
  pMVar1 = pMVar1->next;
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                ,0x13,(pMVar1->entry_data).type,"==",6,"first array entry is a UINT32",0);
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                ,0x14,(pMVar1->entry_data).field_1.int32,"==",1,"first array entry value is 1",0);
  pMVar1 = pMVar1->next;
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                ,0x1a,(pMVar1->entry_data).type,"==",6,"second array entry is a UINT32",0);
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                ,0x1b,(pMVar1->entry_data).field_1.int32,"==",2,"second array entry value is 2",0);
  pMVar1 = pMVar1->next;
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                ,0x21,(pMVar1->entry_data).type,"==",6,"third array entry is a UINT32",0);
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                ,0x22,(pMVar1->entry_data).field_1.int32,"==",3,"third array entry value is 3",0);
  return pMVar1;
}

Assistant:

MMDB_entry_data_list_s *
test_array_value(MMDB_entry_data_list_s *entry_data_list) {
    MMDB_entry_data_list_s *array = entry_data_list = entry_data_list->next;
    cmp_ok(array->entry_data.type,
           "==",
           MMDB_DATA_TYPE_ARRAY,
           "'array' key's value is an array");
    cmp_ok(array->entry_data.data_size,
           "==",
           3,
           "'array' key's value has 3 elements");

    MMDB_entry_data_list_s *idx0 = entry_data_list = entry_data_list->next;
    cmp_ok(idx0->entry_data.type,
           "==",
           MMDB_DATA_TYPE_UINT32,
           "first array entry is a UINT32");
    cmp_ok(idx0->entry_data.uint32, "==", 1, "first array entry value is 1");

    MMDB_entry_data_list_s *idx1 = entry_data_list = entry_data_list->next;
    cmp_ok(idx1->entry_data.type,
           "==",
           MMDB_DATA_TYPE_UINT32,
           "second array entry is a UINT32");
    cmp_ok(idx1->entry_data.uint32, "==", 2, "second array entry value is 2");

    MMDB_entry_data_list_s *idx2 = entry_data_list = entry_data_list->next;
    cmp_ok(idx2->entry_data.type,
           "==",
           MMDB_DATA_TYPE_UINT32,
           "third array entry is a UINT32");
    cmp_ok(idx2->entry_data.uint32, "==", 3, "third array entry value is 3");

    return entry_data_list;
}